

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O0

void __thiscall
sfm::ba::BundleAdjustment::analytic_jacobian
          (BundleAdjustment *this,SparseMatrixType *jac_cam,SparseMatrixType *jac_points)

{
  int iVar1;
  bool bVar2;
  Observation *pOVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  Observation *pOVar8;
  reference pvVar9;
  Triplet local_228;
  Triplet local_210;
  int local_1f4;
  long lStack_1f0;
  int j_1;
  size_t point_offset;
  size_t local_1e0;
  double local_1d8;
  Triplet local_1d0;
  int local_1b4;
  long lStack_1b0;
  int j;
  size_t cam_offset;
  size_t point_col;
  size_t cam_col;
  size_t row_y;
  size_t row_x;
  double local_180;
  reference local_178;
  Camera *cam;
  Point3D *p3d;
  Observation *obs;
  size_t i;
  double point_y_ptr [3];
  double local_138;
  double point_x_ptr [3];
  double local_118;
  double cam_y_ptr [9];
  double local_c8;
  double cam_x_ptr [9];
  undefined1 local_68 [8];
  Triplets point_triplets;
  Triplets cam_triplets;
  size_t jacobi_rows;
  size_t point_cols;
  size_t camera_cols;
  SparseMatrixType *jac_points_local;
  SparseMatrixType *jac_cam_local;
  BundleAdjustment *this_local;
  
  sVar4 = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::size(this->cameras);
  iVar1 = this->num_cam_params;
  sVar5 = std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::size(this->points);
  sVar6 = std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::size
                    (this->observations);
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
            *)&point_triplets.
               super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
            *)local_68);
  if (jac_cam != (SparseMatrixType *)0x0) {
    sVar7 = std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::size
                      (this->observations);
    std::
    vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
    ::resize((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
              *)&point_triplets.
                 super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             sVar7 * (long)this->num_cam_params * 2);
  }
  if (jac_points != (SparseMatrixType *)0x0) {
    sVar7 = std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::size
                      (this->observations);
    std::
    vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
    ::resize((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
              *)local_68,sVar7 * 6);
  }
  for (obs = (Observation *)0x0; pOVar3 = obs,
      pOVar8 = (Observation *)
               std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::size
                         (this->observations), pOVar3 < pOVar8;
      obs = (Observation *)((long)obs->pos + 1)) {
    p3d = (Point3D *)
          std::vector<sfm::ba::Observation,_std::allocator<sfm::ba::Observation>_>::at
                    (this->observations,(size_type)obs);
    cam = (Camera *)
          std::vector<sfm::ba::Point3D,_std::allocator<sfm::ba::Point3D>_>::at
                    (this->points,(long)*(int *)((long)p3d->pos + 0x14));
    local_178 = std::vector<sfm::ba::Camera,_std::allocator<sfm::ba::Camera>_>::at
                          (this->cameras,(long)*(int *)(p3d->pos + 2));
    analytic_jacobian_entries
              (this,local_178,(Point3D *)cam,&local_c8,&local_118,&local_138,(double *)&i);
    if (((ulong)cam->translation[0] & 1) != 0) {
      local_180 = 0.0;
      std::fill<double*,double>(&local_138,point_x_ptr + 2,&local_180);
      row_x = 0;
      std::fill<double*,double>((double *)&i,point_y_ptr + 2,(double *)&row_x);
    }
    row_y = (long)obs * 2;
    cam_col = row_y + 1;
    point_col = (size_t)(*(int *)(p3d->pos + 2) * this->num_cam_params);
    cam_offset = (size_t)(*(int *)((long)p3d->pos + 0x14) * 3);
    lStack_1b0 = (long)obs * (long)this->num_cam_params * 2;
    local_1b4 = 0;
    while( true ) {
      bVar2 = false;
      if (jac_cam != (SparseMatrixType *)0x0) {
        bVar2 = local_1b4 < this->num_cam_params;
      }
      if (!bVar2) break;
      SparseMatrix<double>::Triplet::Triplet
                (&local_1d0,row_y,point_col + (long)local_1b4,cam_x_ptr + (long)local_1b4 + -1);
      pvVar9 = std::
               vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                             *)&point_triplets.
                                super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            lStack_1b0 + local_1b4 * 2);
      pvVar9->value = local_1d0.value;
      pvVar9->row = local_1d0.row;
      pvVar9->col = local_1d0.col;
      SparseMatrix<double>::Triplet::Triplet
                ((Triplet *)&point_offset,cam_col,point_col + (long)local_1b4,
                 cam_y_ptr + (long)local_1b4 + -1);
      pvVar9 = std::
               vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                             *)&point_triplets.
                                super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            lStack_1b0 + (local_1b4 << 1) + 1);
      pvVar9->row = point_offset;
      pvVar9->col = local_1e0;
      pvVar9->value = local_1d8;
      local_1b4 = local_1b4 + 1;
    }
    lStack_1f0 = (long)obs * 6;
    for (local_1f4 = 0; jac_points != (SparseMatrixType *)0x0 && local_1f4 < 3;
        local_1f4 = local_1f4 + 1) {
      SparseMatrix<double>::Triplet::Triplet
                (&local_210,row_y,cam_offset + (long)local_1f4,point_x_ptr + (long)local_1f4 + -1);
      pvVar9 = std::
               vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                             *)local_68,lStack_1f0 + local_1f4 * 2);
      pvVar9->value = local_210.value;
      pvVar9->row = local_210.row;
      pvVar9->col = local_210.col;
      SparseMatrix<double>::Triplet::Triplet
                (&local_228,cam_col,cam_offset + (long)local_1f4,point_y_ptr + (long)local_1f4 + -1)
      ;
      pvVar9 = std::
               vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ::operator[]((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                             *)local_68,lStack_1f0 + (local_1f4 << 1) + 1);
      pvVar9->row = local_228.row;
      pvVar9->col = local_228.col;
      pvVar9->value = local_228.value;
    }
  }
  if (jac_cam != (SparseMatrixType *)0x0) {
    SparseMatrix<double>::allocate(jac_cam,sVar6 << 1,sVar4 * (long)iVar1);
    SparseMatrix<double>::set_from_triplets
              (jac_cam,(Triplets *)
                       &point_triplets.
                        super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (jac_points != (SparseMatrixType *)0x0) {
    SparseMatrix<double>::allocate(jac_points,sVar6 << 1,sVar5 * 3);
    SparseMatrix<double>::set_from_triplets(jac_points,(Triplets *)local_68);
  }
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             *)local_68);
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~vector((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             *)&point_triplets.
                super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
BundleAdjustment::analytic_jacobian (SparseMatrixType* jac_cam,
    SparseMatrixType* jac_points)
{
    std::size_t const camera_cols = this->cameras->size() * this->num_cam_params;
    std::size_t const point_cols = this->points->size() * 3;
    std::size_t const jacobi_rows = this->observations->size() * 2;

    SparseMatrixType::Triplets cam_triplets, point_triplets;
    if (jac_cam != nullptr)
        cam_triplets.resize(this->observations->size() * 2
            * this->num_cam_params);
    if (jac_points != nullptr)
        point_triplets.resize(this->observations->size() * 3 * 2);

#pragma omp parallel
    {
        double cam_x_ptr[9], cam_y_ptr[9], point_x_ptr[3], point_y_ptr[3];
#pragma omp for
        for (std::size_t i = 0; i < this->observations->size(); ++i)
        {
            Observation const& obs = this->observations->at(i);
            Point3D const& p3d = this->points->at(obs.point_id);
            Camera const& cam = this->cameras->at(obs.camera_id);
            this->analytic_jacobian_entries(cam, p3d,
                cam_x_ptr, cam_y_ptr, point_x_ptr, point_y_ptr);

            if (p3d.is_constant)
            {
                std::fill(point_x_ptr, point_x_ptr + 3, 0.0);
                std::fill(point_y_ptr, point_y_ptr + 3, 0.0);
            }

            std::size_t row_x = i * 2, row_y = row_x + 1;
            std::size_t cam_col = obs.camera_id * this->num_cam_params;
            std::size_t point_col = obs.point_id * 3;
            std::size_t cam_offset = i * this->num_cam_params * 2;
            for (int j = 0; jac_cam != nullptr && j < this->num_cam_params; ++j)
            {
                cam_triplets[cam_offset + j * 2 + 0] =
                    SparseMatrixType::Triplet(row_x, cam_col + j, cam_x_ptr[j]);
                cam_triplets[cam_offset + j * 2 + 1] =
                    SparseMatrixType::Triplet(row_y, cam_col + j, cam_y_ptr[j]);
            }
            std::size_t point_offset = i * 3 * 2;
            for (int j = 0; jac_points != nullptr && j < 3; ++j)
            {
                point_triplets[point_offset + j * 2 + 0] =
                    SparseMatrixType::Triplet(row_x, point_col + j, point_x_ptr[j]);
                point_triplets[point_offset + j * 2 + 1] =
                    SparseMatrixType::Triplet(row_y, point_col + j, point_y_ptr[j]);
            }
        }

#pragma omp sections
        {
#pragma omp section
            if (jac_cam != nullptr)
            {
                jac_cam->allocate(jacobi_rows, camera_cols);
                jac_cam->set_from_triplets(cam_triplets);
            }

#pragma omp section
            if (jac_points != nullptr)
            {
                jac_points->allocate(jacobi_rows, point_cols);
                jac_points->set_from_triplets(point_triplets);
            }
        }
    }
}